

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

int testall_hash(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong local_38;
  size_t i;
  size_t reps;
  size_t max_strings;
  size_t num_strings;
  size_t num_keys;
  
  num_strings = 1;
  do {
    if (3 < num_strings) {
      return 0;
    }
    iVar2 = 1000;
    if (num_strings == 1) {
      iVar2 = 100000;
    }
    for (max_strings = 10; max_strings <= (ulong)(long)iVar2; max_strings = max_strings * 10) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = max_strings;
      i = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000)) / auVar1,0);
      if (i == 0) {
        i = 1;
      }
      for (local_38 = 0; local_38 < i; local_38 = local_38 + 1) {
        iVar3 = test_hash(max_strings,num_strings,0);
        if (iVar3 != 0) {
          return 1;
        }
      }
      iVar3 = test_hash(max_strings,num_strings,1);
      if (iVar3 != 0) {
        return 1;
      }
    }
    num_strings = num_strings + 1;
  } while( true );
}

Assistant:

static int
testall_hash(void) {
    size_t num_keys;

    for (num_keys = 1; num_keys <= 3; num_keys++) {
        size_t num_strings;
        size_t max_strings = num_keys == 1 ? 100000 : 1000;

        for (num_strings = 10; num_strings <= max_strings; num_strings *= 10) {
            size_t reps, i;

            reps = 1000 / num_strings;
            if (reps == 0)
                reps = 1;

            for (i = 0; i < reps; i++) {
                if (test_hash(num_strings, num_keys, /* use_dict */ 0) != 0)
                    return(1);
            }

            if (test_hash(num_strings, num_keys, /* use_dict */ 1) != 0)
                return(1);
        }
    }

    return(0);
}